

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

void __thiscall
QShortcutEvent::QShortcutEvent
          (QShortcutEvent *this,QKeySequence *key,QShortcut *shortcut,bool ambiguous)

{
  long lVar1;
  qsizetype qVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QDebug local_48;
  QKeySequence local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QEvent::QEvent(&this->super_QEvent,Shortcut);
  *(undefined ***)this = &PTR__QShortcutEvent_0077cf28;
  QKeySequence::QKeySequence(&this->m_sequence,key);
  this->m_shortcutId = 0;
  this->m_ambiguous = ambiguous;
  if (shortcut != (QShortcut *)0x0) {
    lVar1 = *(long *)&shortcut->field_0x8;
    qVar2 = QtPrivate::indexOf<QKeySequence,QKeySequence>
                      ((QList<QKeySequence> *)(lVar1 + 0x78),key,0);
    if (qVar2 < 0) {
      QMessageLogger::warning();
      pQVar3 = QDebug::operator<<(&local_48,"Given QShortcut does not contain key-sequence ");
      local_40.d = (QKeySequencePrivate *)pQVar3->stream;
      ((Stream *)local_40.d)->ref = ((Stream *)local_40.d)->ref + 1;
      ::operator<<((Stream *)local_38,&local_40);
      QDebug::~QDebug((QDebug *)local_38);
      QDebug::~QDebug((QDebug *)&local_40);
      QDebug::~QDebug(&local_48);
    }
    else {
      this->m_shortcutId = *(int *)(*(long *)(lVar1 + 0xb8) + qVar2 * 4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QShortcutEvent::QShortcutEvent(const QKeySequence &key, const QShortcut *shortcut, bool ambiguous)
    : QEvent(Shortcut), m_sequence(key), m_shortcutId(0), m_ambiguous(ambiguous)
{
    if (shortcut) {
        auto priv = static_cast<const QShortcutPrivate *>(QShortcutPrivate::get(shortcut));
        auto index = priv->sc_sequences.indexOf(key);
        if (index < 0) {
            qWarning() << "Given QShortcut does not contain key-sequence " << key;
            return;
        }
        m_shortcutId = priv->sc_ids[index];
    }
}